

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3AddDefaultValue(Parse *pParse,ExprSpan *pSpan)

{
  short sVar1;
  sqlite3 *db;
  Table *pTVar2;
  Column *pCVar3;
  int iVar4;
  Expr *pEVar5;
  Expr x;
  
  db = pParse->db;
  pTVar2 = pParse->pNewTable;
  if (pTVar2 != (Table *)0x0) {
    sVar1 = pTVar2->nCol;
    pCVar3 = pTVar2->aCol;
    iVar4 = exprIsConst(pSpan->pExpr,(db->init).busy + 4,0);
    if (iVar4 == 0) {
      sqlite3ErrorMsg(pParse,"default value of column [%s] is not constant",
                      pCVar3[(long)sVar1 + -1].zName);
    }
    else {
      sqlite3ExprDelete(db,pCVar3[(long)sVar1 + -1].pDflt);
      x.u.zToken = (char *)0x0;
      x.iColumn = 0;
      x.iAgg = 0;
      x.iRightJoinTable = 0;
      x.op2 = '\0';
      x._55_1_ = 0;
      x.pAggInfo = (AggInfo *)0x0;
      x.x.pList = (ExprList *)0x0;
      x.nHeight = 0;
      x.iTable = 0;
      x.pLeft = (Expr *)0x0;
      x.pRight = (Expr *)0x0;
      x.pTab = (Table *)0x0;
      x.op = 0xa2;
      x.affinity = '\0';
      x._2_2_ = 0;
      x.flags = 0;
      x.u.zToken = sqlite3DbStrNDup(db,pSpan->zStart,
                                    (long)(*(int *)&pSpan->zEnd - (int)pSpan->zStart));
      x.pLeft = pSpan->pExpr;
      x.flags = 0x1000;
      pEVar5 = sqlite3ExprDup(db,&x,1);
      pCVar3[(long)sVar1 + -1].pDflt = pEVar5;
      sqlite3DbFree(db,x.u.zToken);
    }
  }
  sqlite3ExprDelete(db,pSpan->pExpr);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddDefaultValue(Parse *pParse, ExprSpan *pSpan){
  Table *p;
  Column *pCol;
  sqlite3 *db = pParse->db;
  p = pParse->pNewTable;
  if( p!=0 ){
    pCol = &(p->aCol[p->nCol-1]);
    if( !sqlite3ExprIsConstantOrFunction(pSpan->pExpr, db->init.busy) ){
      sqlite3ErrorMsg(pParse, "default value of column [%s] is not constant",
          pCol->zName);
    }else{
      /* A copy of pExpr is used instead of the original, as pExpr contains
      ** tokens that point to volatile memory. The 'span' of the expression
      ** is required by pragma table_info.
      */
      Expr x;
      sqlite3ExprDelete(db, pCol->pDflt);
      memset(&x, 0, sizeof(x));
      x.op = TK_SPAN;
      x.u.zToken = sqlite3DbStrNDup(db, (char*)pSpan->zStart,
                                    (int)(pSpan->zEnd - pSpan->zStart));
      x.pLeft = pSpan->pExpr;
      x.flags = EP_Skip;
      pCol->pDflt = sqlite3ExprDup(db, &x, EXPRDUP_REDUCE);
      sqlite3DbFree(db, x.u.zToken);
    }
  }
  sqlite3ExprDelete(db, pSpan->pExpr);
}